

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall
wallet::wallet_tests::write_wallet_settings_concurrently::test_method
          (write_wallet_settings_concurrently *this)

{
  VType VVar1;
  bool bVar2;
  pointer pCVar3;
  pointer ptVar4;
  pointer ptVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  ulong uVar7;
  thread *ptVar8;
  undefined8 uVar9;
  int *piVar10;
  thread *t;
  pointer ptVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  ulong uVar14;
  thread *ptVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar17;
  thread local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  pointer chain;
  long local_170;
  assertion_result local_168;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_10c;
  int *local_108;
  lazy_ostream local_100;
  undefined1 *local_f0;
  int **local_e8;
  long *local_e0;
  char *local_d8;
  char *local_d0;
  assertion_result local_c8;
  SettingsValue wallets;
  undefined1 **local_58;
  ulong local_50;
  undefined1 *local_48;
  long **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
          _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
          _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x155;
  file.m_begin = (iterator)&local_188;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  pCVar3 = chain;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"wallet","");
  _cVar17 = 0x80f1d8;
  (*pCVar3->_vptr_Chain[0x30])(&wallets,pCVar3,&local_58);
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(wallets.typ == VNULL);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = (int **)&local_c8;
  local_c8._0_8_ = "chain->getRwSetting(\"wallet\").isNull()";
  local_c8.m_message.px = (element_type *)0xf872f0;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_1a0 = "";
  pvVar12 = (iterator)0x2;
  pvVar13 = (iterator)0x0;
  piVar10 = (int *)0x155;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,&local_100,2,0,WARN,_cVar17,(size_t)&local_1a8,0x155);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&wallets.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&wallets.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wallets.val._M_dataplus._M_p != &wallets.val.field_2) {
    operator_delete(wallets.val._M_dataplus._M_p,wallets.val.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,(ulong)(local_48 + 1));
  }
  local_1b0._M_id._M_thread = (id)&chain;
  local_10c = 5;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  wallets.typ = VNULL;
  do {
    ptVar11 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0080fd3a;
        std::__throw_length_error("vector::_M_realloc_insert");
        goto LAB_0080fadd;
      }
      uVar16 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar7 = uVar16 + (uVar16 == 0);
      uVar14 = uVar7 + uVar16;
      piVar10 = (int *)0xfffffffffffffff;
      if (0xffffffffffffffe < uVar14) {
        uVar14 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar7,uVar16)) {
        uVar14 = 0xfffffffffffffff;
      }
      if (uVar14 == 0) {
        ptVar8 = (thread *)0x0;
      }
      else {
        ptVar8 = __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&threads,uVar14,(void *)0x0);
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__1_const&,int&>
                ((allocator_type *)(ptVar8 + uVar16),&local_1b0,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,piVar10);
      ptVar15 = ptVar8;
      for (ptVar5 = ptVar4; ptVar5 != ptVar11; ptVar5 = ptVar5 + 1) {
        (ptVar15->_M_id)._M_thread = 0;
        (ptVar15->_M_id)._M_thread = (ptVar5->_M_id)._M_thread;
        (ptVar5->_M_id)._M_thread = 0;
        ptVar15 = ptVar15 + 1;
      }
      if (ptVar4 != (pointer)0x0) {
        operator_delete(ptVar4,(long)threads.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar4);
      }
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar8 + uVar14;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar8;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__1_const&,int&>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1b0,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,piVar10);
      ptVar15 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar15 + 1;
    ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VVar1 = wallets.typ + VOBJ;
    piVar10 = (int *)(ulong)VVar1;
    bVar2 = (int)wallets.typ < 4;
    ptVar11 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    wallets.typ = VVar1;
  } while (bVar2);
  for (; ptVar11 != ptVar4; ptVar11 = ptVar11 + 1) {
    std::thread::join();
  }
  local_50 = 6;
  local_48 = (undefined1 *)CONCAT17(local_48._7_1_,0x74656c6c6177);
  local_58 = &local_48;
  (*chain->_vptr_Chain[0x30])(&wallets,chain,&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,(ulong)(local_48 + 1));
  }
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x15e;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_013abb30;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  pvVar6 = ::UniValue::getValues(&wallets);
  local_170 = ((long)(pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_e0 = &local_170;
  local_108 = &local_10c;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_170 - local_10c == 0);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_d0 = "";
  local_40 = &local_e0;
  local_50 = local_50 & 0xffffffffffffff00;
  local_58 = &PTR__lazy_ostream_013abb70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_108;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  piVar10 = (int *)0x15e;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf87dbd,(size_t)&local_d8,0x15e,
             &local_58,"num_expected_wallets",&local_100);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&wallets.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&wallets.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wallets.val._M_dataplus._M_p != &wallets.val.field_2) {
    operator_delete(wallets.val._M_dataplus._M_p,wallets.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  local_1b0._M_id._M_thread = (id)&chain;
  local_10c = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  wallets.typ = VNULL;
  do {
    ptVar11 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) goto LAB_0080fadd;
      uVar16 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar7 = uVar16 + (uVar16 == 0);
      uVar14 = uVar7 + uVar16;
      piVar10 = (int *)0xfffffffffffffff;
      if (0xffffffffffffffe < uVar14) {
        uVar14 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar7,uVar16)) {
        uVar14 = 0xfffffffffffffff;
      }
      if (uVar14 == 0) {
        ptVar8 = (thread *)0x0;
      }
      else {
        ptVar8 = __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&threads,uVar14,(void *)0x0);
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__2_const&,int&>
                ((allocator_type *)(ptVar8 + uVar16),&local_1b0,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,piVar10);
      ptVar15 = ptVar8;
      for (ptVar5 = ptVar4; ptVar5 != ptVar11; ptVar5 = ptVar5 + 1) {
        (ptVar15->_M_id)._M_thread = 0;
        (ptVar15->_M_id)._M_thread = (ptVar5->_M_id)._M_thread;
        (ptVar5->_M_id)._M_thread = 0;
        ptVar15 = ptVar15 + 1;
      }
      if (ptVar4 != (pointer)0x0) {
        operator_delete(ptVar4,(long)threads.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar4);
      }
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar8 + uVar14;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar8;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,wallet::wallet_tests::write_wallet_settings_concurrently::test_method()::__2_const&,int&>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1b0,
                 (anon_class_8_1_a7bdc5e1_for__M_head_impl *)&wallets,piVar10);
      ptVar15 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar15 + 1;
    ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VVar1 = wallets.typ + VOBJ;
    piVar10 = (int *)(ulong)VVar1;
    bVar2 = (int)wallets.typ < 4;
    ptVar11 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    wallets.typ = VVar1;
  } while (bVar2);
  for (; ptVar11 != ptVar4; ptVar11 = ptVar11 + 1) {
    std::thread::join();
  }
  local_50 = 6;
  local_48 = (undefined1 *)CONCAT17(local_48._7_1_,0x74656c6c6177);
  local_58 = &local_48;
  (*chain->_vptr_Chain[0x30])(&wallets,chain,&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,(ulong)(local_48 + 1));
  }
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x15e;
  file_01.m_begin = (iterator)&local_138;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
             msg_01);
  local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
  local_168._0_8_ = &PTR__lazy_ostream_013abb30;
  local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  pvVar6 = ::UniValue::getValues(&wallets);
  local_170 = ((long)(pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_170 - local_10c == 0);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_d0 = "";
  local_e0 = &local_170;
  local_50 = local_50 & 0xffffffffffffff00;
  local_58 = &PTR__lazy_ostream_013abb70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_e0;
  local_108 = &local_10c;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf87dbd,(size_t)&local_d8,0x15e,
             &local_58,"num_expected_wallets",&local_100);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&wallets.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&wallets.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wallets.val._M_dataplus._M_p != &wallets.val.field_2) {
    operator_delete(wallets.val._M_dataplus._M_p,wallets.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0080fd3a:
  __stack_chk_fail();
LAB_0080fadd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar9 = std::__throw_length_error("vector::_M_realloc_insert");
    boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
    ::UniValue::~UniValue(&wallets);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar9);
    }
  }
  goto LAB_0080fd3a;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(write_wallet_settings_concurrently, TestingSetup)
{
    auto chain = m_node.chain.get();
    const auto NUM_WALLETS{5};

    // Since we're counting the number of wallets, ensure we start without any.
    BOOST_REQUIRE(chain->getRwSetting("wallet").isNull());

    const auto& check_concurrent_wallet = [&](const auto& settings_function, int num_expected_wallets) {
        std::vector<std::thread> threads;
        threads.reserve(NUM_WALLETS);
        for (auto i{0}; i < NUM_WALLETS; ++i) threads.emplace_back(settings_function, i);
        for (auto& t : threads) t.join();

        auto wallets = chain->getRwSetting("wallet");
        BOOST_CHECK_EQUAL(wallets.getValues().size(), num_expected_wallets);
    };

    // Add NUM_WALLETS wallets concurrently, ensure we end up with NUM_WALLETS stored.
    check_concurrent_wallet([&chain](int i) {
        Assert(AddWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/NUM_WALLETS);

    // Remove NUM_WALLETS wallets concurrently, ensure we end up with 0 wallets.
    check_concurrent_wallet([&chain](int i) {
        Assert(RemoveWalletSetting(*chain, strprintf("wallet_%d", i)));
    },
                            /*num_expected_wallets=*/0);
}